

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase207::run(TestCase207 *this)

{
  _func_int ***ppp_Var1;
  _func_int ***ppp_Var2;
  PromiseNode *pPVar3;
  undefined8 uVar4;
  Disposer *pDVar5;
  TransformPromiseNodeBase *pTVar6;
  int iVar7;
  Own<kj::_::ChainPromiseNode> OVar8;
  Promise<void> promise;
  WaitScope waitScope;
  EventLoop loop;
  Own<kj::_::PromiseNode> local_218;
  Own<kj::_::PromiseNode> local_200;
  Own<kj::_::PromiseNode> local_1f0;
  WaitScope local_1e0;
  ExceptionOrValue local_1d0;
  char local_70;
  EventLoop local_68;
  
  EventLoop::EventLoop(&local_68);
  local_1e0.busyPollInterval = 0xffffffff;
  local_1e0.loop = &local_68;
  EventLoop::enterScope(&local_68);
  local_218.disposer = (Disposer *)0x0;
  local_218.ptr = (PromiseNode *)0x0;
  _::yield();
  pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar6,(Own<kj::_::PromiseNode> *)&local_1d0,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:212:23),_kj::_::PropagateException>
             ::anon_class_8_1_70ebebfb_for_func::operator());
  uVar4 = local_1d0.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004517f8;
  pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_218;
  if ((TransformPromiseNodeBase *)local_1d0.exception.ptr.field_1.value.ownFile.content.ptr !=
      (TransformPromiseNodeBase *)0x0) {
    local_1d0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT71(local_1d0.exception.ptr._1_7_,local_1d0.exception.ptr.isSet)
    )((undefined8 *)CONCAT71(local_1d0.exception.ptr._1_7_,local_1d0.exception.ptr.isSet),
      (char *)(uVar4 + *(long *)(*(long *)uVar4 + -0x10)));
  }
  pDVar5 = local_218.disposer;
  local_218.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase207::run()::$_0,kj::_::PropagateException>>
        ::instance;
  if (local_218.ptr != (PromiseNode *)0x0) {
    ppp_Var1 = &(local_218.ptr)->_vptr_PromiseNode;
    ppp_Var2 = &(local_218.ptr)->_vptr_PromiseNode;
    local_218.ptr = (PromiseNode *)pTVar6;
    (**pDVar5->_vptr_Disposer)(pDVar5,(*ppp_Var1)[-2] + (long)ppp_Var2);
    pTVar6 = (TransformPromiseNodeBase *)local_218.ptr;
  }
  local_218.ptr = &pTVar6->super_PromiseNode;
  iVar7 = 1000;
  do {
    pPVar3 = local_218.ptr;
    pDVar5 = local_218.disposer;
    local_218.ptr = (PromiseNode *)0x0;
    _::yield();
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_1f0,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:226:44),_kj::Promise<void>_>
               ::operator()<>);
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00451880;
    pTVar6[1].dependency.disposer = pDVar5;
    pTVar6[1].dependency.ptr = pPVar3;
    local_200.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::TestCase207::run()::$_1,kj::Promise<void>>,kj::_::PropagateException>>
          ::instance;
    local_200.ptr = (PromiseNode *)pTVar6;
    OVar8 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_1d0,&local_200);
    uVar4 = local_1d0.exception.ptr.field_1.value.ownFile.content.ptr;
    pPVar3 = local_200.ptr;
    pDVar5 = (Disposer *)CONCAT71(local_1d0.exception.ptr._1_7_,local_1d0.exception.ptr.isSet);
    if ((TransformPromiseNodeBase *)local_200.ptr != (TransformPromiseNodeBase *)0x0) {
      local_200.ptr = (PromiseNode *)0x0;
      (**(local_200.disposer)->_vptr_Disposer)
                (local_200.disposer,
                 ((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode,OVar8.ptr);
    }
    pPVar3 = local_1f0.ptr;
    if (local_1f0.ptr != (PromiseNode *)0x0) {
      local_1f0.ptr = (PromiseNode *)0x0;
      (**(local_1f0.disposer)->_vptr_Disposer)
                (local_1f0.disposer,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode
                );
    }
    pPVar3 = local_218.ptr;
    local_218.ptr = (PromiseNode *)uVar4;
    if (pPVar3 != (PromiseNode *)0x0) {
      (**(local_218.disposer)->_vptr_Disposer)
                (local_218.disposer,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode
                );
      local_218.disposer = pDVar5;
      pDVar5 = local_218.disposer;
    }
    local_218.disposer = pDVar5;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  local_1d0.exception.ptr.isSet = false;
  local_70 = '\0';
  _::waitImpl(&local_218,&local_1d0,&local_1e0);
  if (local_70 == '\x01') {
    if ((kj)local_1d0.exception.ptr.isSet != (kj)0x0) {
      throwRecoverableException(&local_1d0.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_1d0.exception.ptr.isSet == (kj)0x0) {
      _::unreachable();
    }
    throwRecoverableException(&local_1d0.exception.ptr.field_1.value,0);
  }
  if ((kj)local_1d0.exception.ptr.isSet == (kj)0x1) {
    Exception::~Exception(&local_1d0.exception.ptr.field_1.value);
  }
  pPVar3 = local_218.ptr;
  if ((TransformPromiseNodeBase *)local_218.ptr != (TransformPromiseNodeBase *)0x0) {
    local_218.ptr = (PromiseNode *)0x0;
    (**(local_218.disposer)->_vptr_Disposer)
              (local_218.disposer,
               ((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_1e0.loop);
  EventLoop::~EventLoop(&local_68);
  return;
}

Assistant:

TEST(Async, DeepChain2) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = nullptr;
  promise = evalLater([&]() {
    auto trace = promise.trace();
    uint lines = 0;
    for (char c: trace) {
      lines += c == '\n';
    }

    // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
    // 2-ish nodes.  We'll give a little room for implementation freedom.
    EXPECT_LT(lines, 5);
  });

  // Create a ridiculous chain of promises.
  for (uint i = 0; i < 1000; i++) {
    promise = evalLater(mvCapture(promise, [](Promise<void> promise) {
      return kj::mv(promise);
    }));
  }

  promise.wait(waitScope);
}